

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_1::BuiltinInputVariationsCase::createInstance
          (BuiltinInputVariationsCase *this,Context *context)

{
  ShaderInputTypes SVar1;
  ShaderRenderCaseInstance *this_00;
  
  this_00 = (ShaderRenderCaseInstance *)operator_new(0x228);
  SVar1 = this->m_shaderInputTypes;
  ShaderRenderCaseInstance::ShaderRenderCaseInstance(this_00,context);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00bd14f8;
  *(ShaderInputTypes *)&this_00[1].super_TestInstance._vptr_TestInstance = SVar1;
  *(undefined8 *)((long)&this_00[1].super_TestInstance._vptr_TestInstance + 4) = 0x3d4ccccd3dcccccd;
  *(undefined8 *)((long)&this_00[1].super_TestInstance.m_context + 4) = 0x3e4ccccd;
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* BuiltinInputVariationsCase::createInstance (Context& context) const
{
	return new BuiltinInputVariationsCaseInstance(context, m_shaderInputTypes);
}